

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkDepthBiasRepresentationInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkDepthBiasRepresentationInfoEXT>
          (Impl *this,VkDepthBiasRepresentationInfoEXT *src,size_t count,ScratchAllocator *alloc)

{
  VkDepthBiasRepresentationInfoEXT *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkDepthBiasRepresentationInfoEXT *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkDepthBiasRepresentationInfoEXT>(alloc,count)
    ;
    if (this_local != (Impl *)0x0) {
      std::copy<VkDepthBiasRepresentationInfoEXT_const*,VkDepthBiasRepresentationInfoEXT*>
                (src,src + count,(VkDepthBiasRepresentationInfoEXT *)this_local);
    }
  }
  return (VkDepthBiasRepresentationInfoEXT *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}